

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# databaseinfo.cpp
# Opt level: O3

void __thiscall DatabaseInfo::acceptWidget(DatabaseInfo *this,DomWidget *node)

{
  QArrayData *pQVar1;
  DomProperty **ppDVar2;
  long lVar3;
  DomProperty *pDVar4;
  DomStringList *pDVar5;
  QString *args;
  int iVar6;
  Node<QString,_DomProperty_*> *pNVar7;
  QList<QString> *pQVar8;
  long lVar9;
  long in_FS_OFFSET;
  bool bVar10;
  QLatin1String QVar11;
  DomProperty *p;
  QHash<QString,_DomProperty_*> properties;
  QString local_98;
  QString local_78;
  QHash<QString,_DomProperty_*> local_58;
  QArrayDataPointer<QString> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &((node->m_property).d.d)->super_QArrayData;
  ppDVar2 = (node->m_property).d.ptr;
  lVar3 = (node->m_property).d.size;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_58.d = (Data<QHashPrivate::Node<QString,_DomProperty_*>_> *)0x0;
  if (lVar3 != 0) {
    lVar9 = 0;
    do {
      local_78.d.d = *(Data **)((long)ppDVar2 + lVar9);
      local_50.d = *(Data **)&((local_78.d.d)->super_QArrayData).ref_;
      local_50.ptr = (QString *)((local_78.d.d)->super_QArrayData).alloc;
      local_50.size._0_4_ = (&(local_78.d.d)->super_QArrayData)[1].ref_;
      local_50.size._4_4_ = (&(local_78.d.d)->super_QArrayData)[1].flags;
      if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QHash<QString,DomProperty*>::emplace<DomProperty*const&>
                ((QHash<QString,DomProperty*> *)&local_58,(QString *)&local_50,
                 (DomProperty **)&local_78);
      if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d)->super_QArrayData,2,0x10);
        }
      }
      lVar9 = lVar9 + 8;
    } while (lVar3 << 3 != lVar9);
  }
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,8,0x10);
    }
  }
  local_50.d = (Data *)0xd;
  local_50.ptr = (QString *)0x17791d;
  if (((local_58.d != (Data<QHashPrivate::Node<QString,_DomProperty_*>_> *)0x0) &&
      (pNVar7 = QHashPrivate::Data<QHashPrivate::Node<QString,_DomProperty_*>_>::
                findNode<QLatin1String>(local_58.d,(QLatin1String *)&local_50),
      pNVar7 != (Node<QString,_DomProperty_*> *)0x0)) &&
     (pDVar4 = pNVar7->value, pDVar4 != (DomProperty *)0x0)) {
    local_50.d = (Data *)(pDVar4->m_bool).d.d;
    local_50.ptr = (QString *)(pDVar4->m_bool).d.ptr;
    local_50.size = (pDVar4->m_bool).d.size;
    if ((QArrayData *)local_50.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((QArrayData *)local_50.d)->ref_)->ref_)._q_value.super___atomic_base<int>.
      _M_i = (((QArrayData *)&((QArrayData *)local_50.d)->ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar11.m_data = &DAT_00000004;
    QVar11.m_size = (qsizetype)&local_50;
    iVar6 = QString::compare(QVar11,0x1774a4);
    if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d)->super_QArrayData,2,0x10);
      }
    }
    if (iVar6 != 0) goto LAB_00140517;
  }
  local_50.d = (Data *)&DAT_00000008;
  local_50.ptr = (QString *)0x177914;
  if (((local_58.d == (Data<QHashPrivate::Node<QString,_DomProperty_*>_> *)0x0) ||
      (pNVar7 = QHashPrivate::Data<QHashPrivate::Node<QString,_DomProperty_*>_>::
                findNode<QLatin1String>(local_58.d,(QLatin1String *)&local_50),
      pNVar7 == (Node<QString,_DomProperty_*> *)0x0)) ||
     ((pNVar7->value == (DomProperty *)0x0 ||
      (pDVar5 = pNVar7->value->m_stringList, pDVar5 == (DomStringList *)0x0)))) {
LAB_00140508:
    TreeWalker::acceptWidget(&this->super_TreeWalker,node);
  }
  else {
    local_50.d = (pDVar5->m_string).d.d;
    args = (pDVar5->m_string).d.ptr;
    local_50.size = (pDVar5->m_string).d.size;
    if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_50.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_50.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_50.ptr = args;
    if ((local_50.size != 0) && ((args->d).size != 0)) {
      QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                ((QMovableArrayOps<QString> *)&this->m_connections,(this->m_connections).d.size,args
                );
      QList<QString>::end(&this->m_connections);
      if ((ulong)local_50.size < 2) {
        local_78.d.d = (Data *)0x0;
        local_78.d.ptr = (char16_t *)0x0;
        local_78.d.size = 0;
      }
      else {
        local_78.d.d = local_50.ptr[1].d.d;
        local_78.d.ptr = local_50.ptr[1].d.ptr;
        local_78.d.size = local_50.ptr[1].d.size;
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
          super___atomic_base<int>._M_i =
               (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        if (local_78.d.size != 0) {
          pQVar8 = QMap<QString,_QList<QString>_>::operator[](&this->m_cursors,args);
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)pQVar8,(pQVar8->d).size,&local_78);
          QList<QString>::end(pQVar8);
          if ((ulong)local_50.size < 3) {
            local_98.d.d = (Data *)0x0;
            local_98.d.ptr = (char16_t *)0x0;
            local_98.d.size = 0;
            bVar10 = true;
          }
          else {
            local_98.d.d = local_50.ptr[2].d.d;
            local_98.d.ptr = local_50.ptr[2].d.ptr;
            local_98.d.size = local_50.ptr[2].d.size;
            if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              (((QArrayData *)&((local_98.d.d)->super_QArrayData).ref_)->ref_)._q_value.
              super___atomic_base<int>._M_i =
                   (((QArrayData *)&((local_98.d.d)->super_QArrayData).ref_)->ref_)._q_value.
                   super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            bVar10 = local_98.d.size == 0;
            if (!bVar10) {
              pQVar8 = QMap<QString,_QList<QString>_>::operator[](&this->m_fields,args);
              QList<QString>::append(pQVar8,&local_98);
            }
          }
          if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
            }
          }
          QArrayDataPointer<QString>::~QArrayDataPointer(&local_50);
          if (bVar10) goto LAB_00140517;
          goto LAB_00140508;
        }
      }
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_50);
  }
LAB_00140517:
  QHash<QString,_DomProperty_*>::~QHash(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void DatabaseInfo::acceptWidget(DomWidget *node)
{
    QHash<QString, DomProperty*> properties = propertyMap(node->elementProperty());

    DomProperty *frameworkCode = properties.value("frameworkCode"_L1);
    if (frameworkCode && !toBool(frameworkCode->elementBool()))
        return;

    DomProperty *db = properties.value("database"_L1);
    if (db && db->elementStringList()) {
        QStringList info = db->elementStringList()->elementString();
        if (info.isEmpty() || info.constFirst().isEmpty())
            return;
        const QString &connection = info.constFirst();
        m_connections.append(connection);

        QString table = info.size() > 1 ? info.at(1) : QString();
        if (table.isEmpty())
            return;
        m_cursors[connection].append(table);

        QString field = info.size() > 2 ? info.at(2) : QString();
        if (field.isEmpty())
            return;
        m_fields[connection].append(field);
    }

    TreeWalker::acceptWidget(node);
}